

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O2

void __thiscall
anurbs::TrimmedSurfaceClipping::add_curve(TrimmedSurfaceClipping *this,CurveBase<2L> *curve)

{
  pointer pvVar1;
  pointer pIVar2;
  pointer pIVar3;
  CurveBaseD *in_RDX;
  Index i;
  long lVar4;
  long lVar5;
  IntPoint pt;
  IntPoint local_70;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_60;
  
  pvVar1 = (this->m_paths).
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  CurveTessellation<2L>::compute(&local_60,(CurveTessellation<2L> *)curve,in_RDX,this->m_tolerance);
  lVar5 = 0;
  for (lVar4 = 0;
      lVar4 < (long)local_60.second.
                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_60.second.
                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4; lVar4 = lVar4 + 1) {
    local_70 = to_int_pt(this,(Vector *)
                              ((long)((local_60.second.
                                       super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                     m_storage.m_data.array + lVar5));
    if ((((lVar5 != 0) ||
         (pIVar2 = pvVar1[-1].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
         pIVar3 = pvVar1[-1].
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         pIVar2 == pIVar3 || (long)pIVar2 - (long)pIVar3 < 0)) || (pIVar2[-1].X != local_70.X)) ||
       (pIVar2[-1].Y != local_70.Y)) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                (pvVar1 + -1,&local_70);
    }
    lVar5 = lVar5 + 0x10;
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::~pair(&local_60);
  return;
}

Assistant:

void add_curve(CurveBase<2>& curve)
    {
        ClipperLib::Path& path = m_paths.back();

        const auto [ts, points] = CurveTessellation<2>::compute(curve, m_tolerance);

        for (Index i = 0; i < length(points); i++) {
            auto pt = to_int_pt(points[i]);

            if (i == 0 && length(path) > 0 && path.back() == pt) {
                continue;
            }

            path.push_back(pt);
        }
    }